

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivy.h
# Opt level: O1

int Ivy_ObjLevelNew(Ivy_Obj_t *pObj)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
  uVar2 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
  if (*(uint *)(uVar2 + 8) >> 0xb < *(uint *)(uVar1 + 8) >> 0xb) {
    uVar2 = uVar1;
  }
  return (*(uint *)(uVar2 + 8) >> 0xb) + (uint)((*(uint *)&pObj->field_0x8 & 0xf) == 6) + 1;
}

Assistant:

static inline int          Ivy_ObjLevelNew( Ivy_Obj_t * pObj )    { return 1 + Ivy_ObjIsExor(pObj) + IVY_MAX(Ivy_ObjFanin0(pObj)->Level, Ivy_ObjFanin1(pObj)->Level);       }